

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluComposeLut(int nVars,If_Grp_t *g,word *t,word (*f) [1024],word *r)

{
  int local_2040;
  int local_203c;
  int v;
  int m;
  word c [1024];
  word *r_local;
  word (*f_local) [1024];
  word *t_local;
  If_Grp_t *g_local;
  int nVars_local;
  
  If_CluClear(r,nVars);
  for (local_203c = 0; local_203c < 1 << (g->nVars & 0x1fU); local_203c = local_203c + 1) {
    if ((t[local_203c >> 6] >> ((byte)local_203c & 0x3f) & 1) != 0) {
      If_CluFill((word *)&v,nVars);
      for (local_2040 = 0; local_2040 < g->nVars; local_2040 = local_2040 + 1) {
        if ((local_203c >> ((byte)local_2040 & 0x1f) & 1U) == 0) {
          If_CluSharp((word *)&v,(word *)&v,f[local_2040],nVars);
        }
        else {
          If_CluAnd((word *)&v,(word *)&v,f[local_2040],nVars);
        }
      }
      If_CluOr(r,r,(word *)&v,nVars);
    }
  }
  return;
}

Assistant:

static void If_CluComposeLut( int nVars, If_Grp_t * g, word * t, word f[6][CLU_WRD_MAX], word * r )
{
    word c[CLU_WRD_MAX];
    int m, v;
    If_CluClear( r, nVars ); 
    for ( m = 0; m < (1<<g->nVars); m++ )
    {
        if ( !((t[m >> 6] >> (m & 63)) & 1) )
            continue;
        If_CluFill( c, nVars );
        for ( v = 0; v < g->nVars; v++ )
            if ( (m >> v) & 1 )
                If_CluAnd( c, c, f[v], nVars );
            else
                If_CluSharp( c, c, f[v], nVars );
        If_CluOr( r, r, c, nVars );
    }
}